

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SectionInfo * __thiscall Catch::SectionInfo::addSubSection(SectionInfo *this,string *name)

{
  SectionInfo *pSVar1;
  _Rb_tree_header *p_Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>
  local_50;
  
  pSVar1 = (SectionInfo *)operator_new(0x40);
  pSVar1->m_status = Unknown;
  p_Var2 = &(pSVar1->m_subSections)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar1->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar1->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (pSVar1->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar1->m_parent = this;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  local_50.second = pSVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::SectionInfo*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>
              *)&this->m_subSections,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->m_status = Branch;
  return pSVar1;
}

Assistant:

SectionInfo* addSubSection( const std::string& name ) {
            SectionInfo* subSection = new SectionInfo( this );
            m_subSections.insert( std::make_pair( name, subSection ) );
            m_status = Branch;
            return subSection;
        }